

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O0

void __thiscall
icu_63::PluralFormat::PluralFormat(PluralFormat *this,PluralRules *rules,UErrorCode *status)

{
  Locale *other;
  UErrorCode *status_local;
  PluralRules *rules_local;
  PluralFormat *this_local;
  
  Format::Format(&this->super_Format);
  (this->super_Format).super_UObject._vptr_UObject = (_func_int **)&PTR__PluralFormat_004ae990;
  other = Locale::getDefault();
  Locale::Locale(&this->locale,other);
  MessagePattern::MessagePattern(&this->msgPattern,status);
  this->numberFormat = (NumberFormat *)0x0;
  this->offset = 0.0;
  PluralSelectorAdapter::PluralSelectorAdapter(&this->pluralRulesWrapper);
  init(this,(EVP_PKEY_CTX *)rules);
  return;
}

Assistant:

PluralFormat::PluralFormat(const PluralRules& rules, UErrorCode& status)
        : locale(Locale::getDefault()),
          msgPattern(status),
          numberFormat(NULL),
          offset(0) {
    init(&rules, UPLURAL_TYPE_COUNT, status);
}